

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.h
# Opt level: O3

void __thiscall
gpu::BlendFilters<unsigned_char>::apply
          (BlendFilters<unsigned_char> *this,uchar *pixelBaseR,uchar *pixelBaseG,uchar *pixelBaseB,
          uchar *pixelBlendR,uchar *pixelBlendG,uchar *pixelBlendB,uchar *pixelDestinationR,
          uchar *pixelDestinationG,uchar *pixelDestinationB,float alpha,BlendType blendType)

{
  uchar uVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  switch(blendType) {
  case BLEND_FILTER_NORMAL:
  case BLEND_FILTER_LINEARDODGE:
    fVar7 = (float)*pixelBaseR * (1.0 - alpha) + (float)*pixelBaseR * alpha;
    fVar6 = 255.0;
    if ((fVar7 <= 255.0) && (fVar6 = fVar7, fVar7 < 0.0)) {
      fVar6 = 0.0;
    }
    *pixelDestinationR = (uchar)(int)fVar6;
    fVar7 = (float)*pixelBaseG * (1.0 - alpha) + (float)*pixelBaseG * alpha;
    fVar6 = 255.0;
    if ((fVar7 <= 255.0) && (fVar6 = fVar7, fVar7 < 0.0)) {
      fVar6 = 0.0;
    }
    *pixelDestinationG = (uchar)(int)fVar6;
    bVar4 = *pixelBaseB;
    fVar7 = (float)bVar4;
    break;
  case BLEND_FILTER_LIGHTEN:
    bVar4 = *pixelBaseR;
    bVar2 = *pixelBlendR;
    if (*pixelBlendR <= bVar4) {
      bVar2 = bVar4;
    }
    fVar7 = (float)bVar4 * (1.0 - alpha) + (float)bVar2 * alpha;
    fVar6 = 255.0;
    if ((fVar7 <= 255.0) && (fVar6 = fVar7, fVar7 < 0.0)) {
      fVar6 = 0.0;
    }
    *pixelDestinationR = (uchar)(int)fVar6;
    bVar4 = *pixelBaseG;
    bVar2 = *pixelBlendG;
    if (*pixelBlendG <= bVar4) {
      bVar2 = bVar4;
    }
    fVar7 = (float)bVar4 * (1.0 - alpha) + (float)bVar2 * alpha;
    fVar6 = 255.0;
    if ((fVar7 <= 255.0) && (fVar6 = fVar7, fVar7 < 0.0)) {
      fVar6 = 0.0;
    }
    *pixelDestinationG = (uchar)(int)fVar6;
    bVar4 = *pixelBaseB;
    bVar2 = *pixelBlendB;
    if (*pixelBlendB <= bVar4) {
      bVar2 = bVar4;
    }
    goto LAB_00153380;
  case BLEND_FILTER_DARKEN:
    bVar4 = *pixelBaseR;
    bVar2 = *pixelBlendR;
    if (bVar4 <= *pixelBlendR) {
      bVar2 = bVar4;
    }
    fVar7 = (float)bVar4 * (1.0 - alpha) + (float)bVar2 * alpha;
    fVar6 = 255.0;
    if ((fVar7 <= 255.0) && (fVar6 = fVar7, fVar7 < 0.0)) {
      fVar6 = 0.0;
    }
    *pixelDestinationR = (uchar)(int)fVar6;
    bVar4 = *pixelBaseG;
    bVar2 = *pixelBlendG;
    if (bVar4 <= *pixelBlendG) {
      bVar2 = bVar4;
    }
    fVar7 = (float)bVar4 * (1.0 - alpha) + (float)bVar2 * alpha;
    fVar6 = 255.0;
    if ((fVar7 <= 255.0) && (fVar6 = fVar7, fVar7 < 0.0)) {
      fVar6 = 0.0;
    }
    *pixelDestinationG = (uchar)(int)fVar6;
    bVar4 = *pixelBaseB;
    bVar2 = *pixelBlendB;
    if (bVar4 <= *pixelBlendB) {
      bVar2 = bVar4;
    }
LAB_00153380:
    fVar7 = (float)bVar2;
    break;
  case BLEND_FILTER_MULTIPLY:
    fVar7 = (float)*pixelBaseR * (1.0 - alpha) +
            (float)(((uint)*pixelBlendR * (uint)*pixelBaseR) / 0xff) * alpha;
    fVar6 = 255.0;
    if ((fVar7 <= 255.0) && (fVar6 = fVar7, fVar7 < 0.0)) {
      fVar6 = 0.0;
    }
    *pixelDestinationR = (uchar)(int)fVar6;
    fVar7 = (float)*pixelBaseG * (1.0 - alpha) +
            (float)(((uint)*pixelBlendG * (uint)*pixelBaseG) / 0xff) * alpha;
    fVar6 = 255.0;
    if ((fVar7 <= 255.0) && (fVar6 = fVar7, fVar7 < 0.0)) {
      fVar6 = 0.0;
    }
    *pixelDestinationG = (uchar)(int)fVar6;
    bVar4 = *pixelBaseB;
    fVar7 = (float)(((uint)*pixelBlendB * (uint)bVar4) / 0xff);
    break;
  case BLEND_FILTER_AVERAGE:
    fVar7 = (float)*pixelBaseR * (1.0 - alpha) +
            (float)((uint)*pixelBlendR + (uint)*pixelBaseR >> 1) * alpha;
    fVar6 = 255.0;
    if ((fVar7 <= 255.0) && (fVar6 = fVar7, fVar7 < 0.0)) {
      fVar6 = 0.0;
    }
    *pixelDestinationR = (uchar)(int)fVar6;
    fVar7 = (float)*pixelBaseG * (1.0 - alpha) +
            (float)((uint)*pixelBlendG + (uint)*pixelBaseG >> 1) * alpha;
    fVar6 = 255.0;
    if ((fVar7 <= 255.0) && (fVar6 = fVar7, fVar7 < 0.0)) {
      fVar6 = 0.0;
    }
    *pixelDestinationG = (uchar)(int)fVar6;
    bVar4 = *pixelBaseB;
    fVar7 = (float)((uint)*pixelBlendB + (uint)bVar4 >> 1);
    break;
  default:
    goto switchD_00152cb4_caseD_5;
  case BLEND_FILTER_SUBTRACT:
  case BLEND_FILTER_LINEARBURN:
    uVar5 = (uint)*pixelBlendR + (uint)*pixelBaseR;
    fVar7 = 0.0;
    if (0xfe < uVar5) {
      fVar7 = (float)(int)(uVar5 - 0xff);
    }
    fVar6 = 1.0 - alpha;
    fVar7 = (float)*pixelBaseR * fVar6 + fVar7 * alpha;
    fVar8 = 255.0;
    if ((fVar7 <= 255.0) && (fVar8 = fVar7, fVar7 < 0.0)) {
      fVar8 = 0.0;
    }
    *pixelDestinationR = (uchar)(int)fVar8;
    uVar5 = (uint)*pixelBlendG + (uint)*pixelBaseG;
    fVar7 = 0.0;
    if (0xfe < uVar5) {
      fVar7 = (float)(int)(uVar5 - 0xff);
    }
    fVar7 = (float)*pixelBaseG * fVar6 + fVar7 * alpha;
    fVar8 = 255.0;
    if ((fVar7 <= 255.0) && (fVar8 = fVar7, fVar7 < 0.0)) {
      fVar8 = 0.0;
    }
    *pixelDestinationG = (uchar)(int)fVar8;
    uVar5 = (uint)*pixelBlendB + (uint)*pixelBaseB;
    fVar7 = 0.0;
    if (0xfe < uVar5) {
      fVar7 = (float)(int)(uVar5 - 0xff);
    }
    fVar7 = fVar6 * (float)*pixelBaseB + fVar7 * alpha;
    fVar6 = 255.0;
    if ((fVar7 <= 255.0) && (fVar6 = fVar7, fVar7 < 0.0)) {
      fVar6 = 0.0;
    }
    uVar1 = (uchar)(int)fVar6;
    goto LAB_001534a7;
  case BLEND_FILTER_DIFFERENCE:
    uVar3 = (uint)*pixelBaseR - (uint)*pixelBlendR;
    uVar5 = -uVar3;
    if (0 < (int)uVar3) {
      uVar5 = uVar3;
    }
    fVar7 = 1.0 - alpha;
    fVar6 = (float)*pixelBaseR * fVar7 + (float)(uVar5 & 0xff) * alpha;
    fVar8 = 255.0;
    if ((fVar6 <= 255.0) && (fVar8 = fVar6, fVar6 < 0.0)) {
      fVar8 = 0.0;
    }
    *pixelDestinationR = (uchar)(int)fVar8;
    uVar3 = (uint)*pixelBaseG - (uint)*pixelBlendG;
    uVar5 = -uVar3;
    if (0 < (int)uVar3) {
      uVar5 = uVar3;
    }
    fVar6 = (float)*pixelBaseG * fVar7 + (float)(uVar5 & 0xff) * alpha;
    fVar8 = 255.0;
    if ((fVar6 <= 255.0) && (fVar8 = fVar6, fVar6 < 0.0)) {
      fVar8 = 0.0;
    }
    *pixelDestinationG = (uchar)(int)fVar8;
    uVar3 = (uint)*pixelBaseB - (uint)*pixelBlendB;
    uVar5 = -uVar3;
    if (0 < (int)uVar3) {
      uVar5 = uVar3;
    }
    fVar7 = fVar7 * (float)*pixelBaseB + (float)(uVar5 & 0xff) * alpha;
    goto LAB_0015348c;
  case BLEND_FILTER_NEGATION:
    negation(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    negation(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    negation(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_SCREEN:
    screen(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    screen(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    screen(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_EXCLUSION:
    exclusion(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    exclusion(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    exclusion(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_OVERLAY:
    overlay(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    overlay(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    overlay(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_SOFTLIGHT:
    softLight(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    softLight(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    softLight(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_HARDLIGHT:
    hardLight(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    hardLight(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    hardLight(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_COLORDODGE:
    colorDodge(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    colorDodge(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    colorDodge(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_COLORBURN:
    colorBurn(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    colorBurn(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    colorBurn(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_LINEARLIGHT:
    linearLight(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    linearLight(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    linearLight(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_VIVIDLIGHT:
    vividLight(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    vividLight(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    vividLight(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_PINLIGHT:
    pinLight(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    pinLight(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    pinLight(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_HARDMIX:
    hardMix(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    hardMix(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    hardMix(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  }
  fVar7 = (1.0 - alpha) * (float)bVar4 + fVar7 * alpha;
LAB_0015348c:
  fVar6 = 255.0;
  if ((fVar7 <= 255.0) && (fVar6 = fVar7, fVar7 < 0.0)) {
    fVar6 = 0.0;
  }
  uVar1 = (uchar)(int)fVar6;
LAB_001534a7:
  *pixelDestinationB = uVar1;
switchD_00152cb4_caseD_5:
  return;
}

Assistant:

FUNCTION_PREFIX void BlendFilters<T>::apply(T& pixelBaseR, 
                                                T& pixelBaseG,
                                                T& pixelBaseB,
                                                T& pixelBlendR, 
                                                T& pixelBlendG,
                                                T& pixelBlendB, 
                                                T& pixelDestinationR, 
                                                T& pixelDestinationG,
                                                T& pixelDestinationB,
                                                float alpha,
                                                BlendType blendType)
    {
      switch(blendType)
      {
      case BLEND_FILTER_NORMAL:      
        normal(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        normal(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        normal(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_LIGHTEN:       
        lighten(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        lighten(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        lighten(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_DARKEN:       
        darken(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        darken(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        darken(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_MULTIPLY:     
        multiply(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        multiply(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        multiply(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_AVERAGE:      
        average(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        average(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        average(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_ADD:        
        add(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        add(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        add(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_SUBTRACT:    
        subtract(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        subtract(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        subtract(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_DIFFERENCE:   
        difference(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        difference(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        difference(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_NEGATION:     
        negation(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        negation(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        negation(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_SCREEN:       
        screen(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        screen(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        screen(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_EXCLUSION:   
        exclusion(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        exclusion(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        exclusion(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;   

      case BLEND_FILTER_OVERLAY:      
        overlay(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        overlay(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        overlay(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_SOFTLIGHT:   
        softLight(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        softLight(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        softLight(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;  

      case BLEND_FILTER_HARDLIGHT:    
        hardLight(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        hardLight(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        hardLight(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_COLORDODGE:    
        colorDodge(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        colorDodge(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        colorDodge(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_COLORBURN:     
        colorBurn(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        colorBurn(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        colorBurn(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_LINEARDODGE:   
        normal(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        normal(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        normal(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_LINEARBURN:    
        linearBurn(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        linearBurn(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        linearBurn(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_LINEARLIGHT: 
        linearLight(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        linearLight(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        linearLight(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_VIVIDLIGHT:   

        vividLight(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        vividLight(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        vividLight(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_PINLIGHT:     
        pinLight(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        pinLight(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        pinLight(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_HARDMIX:     
        hardMix(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        hardMix(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        hardMix(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      }
    }